

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void decode_partition(AV1Decoder *pbi,ThreadData *td,int mi_row,int mi_col,aom_reader *reader,
                     BLOCK_SIZE bsize,int parse_decode_flag)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint mi_row_00;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int in_ECX;
  int in_EDX;
  AV1Decoder *in_RSI;
  AV1Decoder *in_RDI;
  aom_reader *in_R8;
  BLOCK_SIZE in_R9B;
  int unaff_retaddr;
  uint in_stack_00000008;
  int this_mi_col;
  int i_1;
  int this_mi_row;
  int i;
  macroblockd_plane *pd_u;
  int runit_idx;
  int rcol;
  int rrow;
  int rstride;
  int rrow1;
  int rrow0;
  int rcol1;
  int rcol0;
  int plane;
  int num_planes;
  int has_cols;
  int has_rows;
  BLOCK_SIZE bsize2;
  int quarter_step;
  BLOCK_SIZE subsize;
  PARTITION_TYPE partition;
  int hbs;
  int bw;
  MACROBLOCKD *xd;
  DecoderCodingBlock *dcb;
  AV1_COMMON *cm;
  undefined2 uVar10;
  undefined1 *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  aom_reader *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int iVar11;
  int local_74;
  int in_stack_ffffffffffffff90;
  int iVar12;
  int local_6c;
  int local_68;
  int local_64;
  undefined4 in_stack_ffffffffffffffac;
  int iVar13;
  BLOCK_SIZE BVar14;
  int in_stack_ffffffffffffffb4;
  undefined1 uVar15;
  PARTITION_TYPE PVar16;
  AV1_COMMON *cm_00;
  undefined7 in_stack_ffffffffffffffd8;
  AV1Decoder *pbi_00;
  
  cm_00 = &in_RDI->common;
  uVar3 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_R9B]
  ;
  iVar4 = (int)uVar3 >> 1;
  mi_row_00 = uVar3 / 4;
  pbi_00 = in_RSI;
  BVar1 = get_partition_subsize
                    ((BLOCK_SIZE)((ulong)in_stack_ffffffffffffff40 >> 0x30),
                     (PARTITION_TYPE)((ulong)in_stack_ffffffffffffff40 >> 0x28));
  uVar10 = (undefined2)((ulong)in_stack_ffffffffffffff40 >> 0x28);
  iVar13 = CONCAT13(BVar1,(int3)in_stack_ffffffffffffffac);
  uVar5 = (uint)(in_EDX + iVar4 < (cm_00->mi_params).mi_rows);
  uVar6 = (uint)(in_ECX + iVar4 < (cm_00->mi_params).mi_cols);
  if ((in_EDX < (cm_00->mi_params).mi_rows) && (in_ECX < (cm_00->mi_params).mi_cols)) {
    if ((in_stack_00000008 & 1) == 0) {
      bVar2 = get_partition(cm_00,in_EDX,in_ECX,in_R9B);
      uVar3 = (uint)bVar2;
    }
    else {
      iVar7 = av1_num_planes(cm_00);
      local_64 = 0;
      while( true ) {
        uVar10 = (undefined2)((ulong)in_stack_ffffffffffffff40 >> 0x28);
        if (iVar7 <= local_64) break;
        iVar12 = in_stack_ffffffffffffff90;
        if (cm_00->rst_info[local_64].frame_restoration_type != RESTORE_NONE) {
          in_stack_ffffffffffffff40 = &stack0xffffffffffffff90;
          iVar8 = av1_loop_restoration_corners_in_sb
                            ((AV1Common *)CONCAT44(uVar3,iVar4),in_stack_ffffffffffffffb4,mi_row_00,
                             iVar13,(BLOCK_SIZE)(uVar5 >> 0x18),(int *)CONCAT44(uVar6,iVar7),
                             (int *)cm_00,(int *)CONCAT17(in_R9B,in_stack_ffffffffffffffd8),
                             (int *)in_R8);
          iVar12 = in_stack_ffffffffffffff90;
          if (iVar8 != 0) {
            iVar8 = cm_00->rst_info[local_64].horz_units;
            for (; iVar11 = local_68, in_stack_ffffffffffffff90 < local_74;
                in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 + 1) {
              for (; iVar11 < local_6c; iVar11 = iVar11 + 1) {
                in_stack_ffffffffffffff7c = iVar11 + in_stack_ffffffffffffff90 * iVar8;
                loop_restoration_read_sb_coeffs
                          ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff90,iVar11),
                           (MACROBLOCKD *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                           in_stack_ffffffffffffff68);
              }
            }
          }
        }
        local_64 = local_64 + 1;
        in_stack_ffffffffffffff90 = iVar12;
      }
      if (in_R9B < BLOCK_8X8) {
        in_stack_ffffffffffffff5c = 0;
        uVar3 = in_stack_ffffffffffffff5c;
      }
      else {
        bVar2 = read_partition((MACROBLOCKD *)
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                               (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                               (int)in_stack_ffffffffffffff70,
                               (aom_reader *)
                               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                               in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,
                               (BLOCK_SIZE)in_stack_ffffffffffffff90);
        in_stack_ffffffffffffff5c = (uint)bVar2;
        uVar3 = in_stack_ffffffffffffff5c;
      }
    }
    BVar14 = (BLOCK_SIZE)((uint)iVar13 >> 0x18);
    uVar15 = (undefined1)uVar3;
    BVar1 = get_partition_subsize((BLOCK_SIZE)((ushort)uVar10 >> 8),(PARTITION_TYPE)uVar10);
    iVar13 = (uint)CONCAT11(uVar15,BVar1) << 0x10;
    if (BVar1 == BLOCK_INVALID) {
      (in_RSI->dcb).xd.mi_row = in_EDX;
      aom_internal_error((in_RSI->dcb).xd.error_info,AOM_CODEC_CORRUPT_FRAME,
                         "Partition is invalid for block size %dx%d",(ulong)block_size_wide[in_R9B],
                         (ulong)block_size_high[in_R9B]);
    }
    BVar1 = get_plane_block_size
                      ((BLOCK_SIZE)((uint)iVar13 >> 0x10),(in_RSI->dcb).xd.plane[1].subsampling_x,
                       (in_RSI->dcb).xd.plane[1].subsampling_y);
    if (BVar1 == BLOCK_INVALID) {
      (in_RSI->dcb).xd.mi_row = in_EDX;
      bVar2 = (byte)((uint)iVar13 >> 0x10);
      aom_internal_error((in_RSI->dcb).xd.error_info,AOM_CODEC_CORRUPT_FRAME,
                         "Block size %dx%d invalid with this subsampling mode",
                         (ulong)block_size_wide[bVar2],(ulong)block_size_high[bVar2]);
    }
    uVar10 = (undefined2)((uint)iVar13 >> 0x10);
    bVar2 = (byte)((uint)iVar13 >> 0x18);
    uVar9 = (ulong)bVar2;
    BVar1 = (BLOCK_SIZE)((uint)iVar13 >> 0x10);
    switch(uVar9) {
    case 0:
      (*decode_partition::block_visit[(int)in_stack_00000008])
                (in_RDI,(ThreadData *)pbi_00,in_EDX,in_ECX,in_R8,bVar2,BVar1);
      break;
    case 1:
      (*decode_partition::block_visit[(int)in_stack_00000008])
                (in_RDI,(ThreadData *)pbi_00,in_EDX,in_ECX,in_R8,bVar2,BVar1);
      if (uVar5 != 0) {
        (*decode_partition::block_visit[(int)in_stack_00000008])
                  (in_RDI,(ThreadData *)pbi_00,in_EDX + iVar4,in_ECX,in_R8,
                   (PARTITION_TYPE)((ushort)uVar10 >> 8),(BLOCK_SIZE)uVar10);
      }
      break;
    case 2:
      (*decode_partition::block_visit[(int)in_stack_00000008])
                (in_RDI,(ThreadData *)pbi_00,in_EDX,in_ECX,in_R8,bVar2,BVar1);
      if (uVar6 != 0) {
        (*decode_partition::block_visit[(int)in_stack_00000008])
                  (in_RDI,(ThreadData *)pbi_00,in_EDX,in_ECX + iVar4,in_R8,
                   (PARTITION_TYPE)((ushort)uVar10 >> 8),(BLOCK_SIZE)uVar10);
      }
      break;
    case 3:
      decode_partition(pbi_00,(ThreadData *)CONCAT44(in_EDX,in_ECX),(int)((ulong)in_R8 >> 0x20),
                       (int)in_R8,(aom_reader *)CONCAT17(in_R9B,in_stack_ffffffffffffffd8),
                       (BLOCK_SIZE)((ulong)cm_00 >> 0x38),unaff_retaddr);
      BVar1 = (BLOCK_SIZE)((ulong)cm_00 >> 0x38);
      decode_partition(pbi_00,(ThreadData *)CONCAT44(in_EDX,in_ECX),(int)((ulong)in_R8 >> 0x20),
                       (int)in_R8,(aom_reader *)CONCAT17(in_R9B,in_stack_ffffffffffffffd8),BVar1,
                       unaff_retaddr);
      decode_partition(pbi_00,(ThreadData *)CONCAT44(in_EDX,in_ECX),(int)((ulong)in_R8 >> 0x20),
                       (int)in_R8,(aom_reader *)CONCAT17(in_R9B,in_stack_ffffffffffffffd8),BVar1,
                       unaff_retaddr);
      decode_partition(pbi_00,(ThreadData *)CONCAT44(in_EDX,in_ECX),(int)((ulong)in_R8 >> 0x20),
                       (int)in_R8,(aom_reader *)CONCAT17(in_R9B,in_stack_ffffffffffffffd8),BVar1,
                       unaff_retaddr);
      break;
    case 4:
      (*decode_partition::block_visit[(int)in_stack_00000008])
                (in_RDI,(ThreadData *)pbi_00,in_EDX,in_ECX,in_R8,bVar2,BVar14);
      (*decode_partition::block_visit[(int)in_stack_00000008])
                (in_RDI,(ThreadData *)pbi_00,in_EDX,in_ECX + iVar4,in_R8,
                 (PARTITION_TYPE)((ushort)uVar10 >> 8),BVar14);
      (*decode_partition::block_visit[(int)in_stack_00000008])
                (in_RDI,(ThreadData *)pbi_00,in_EDX + iVar4,in_ECX,in_R8,
                 (PARTITION_TYPE)((ushort)uVar10 >> 8),(BLOCK_SIZE)uVar10);
      break;
    case 5:
      (*decode_partition::block_visit[(int)in_stack_00000008])
                (in_RDI,(ThreadData *)pbi_00,in_EDX,in_ECX,in_R8,bVar2,BVar1);
      PVar16 = (PARTITION_TYPE)((uint)iVar13 >> 0x18);
      (*decode_partition::block_visit[(int)in_stack_00000008])
                (in_RDI,(ThreadData *)pbi_00,in_EDX + iVar4,in_ECX,in_R8,PVar16,BVar14);
      (*decode_partition::block_visit[(int)in_stack_00000008])
                (in_RDI,(ThreadData *)pbi_00,in_EDX + iVar4,in_ECX + iVar4,in_R8,PVar16,BVar14);
      break;
    case 6:
      (*decode_partition::block_visit[(int)in_stack_00000008])
                (in_RDI,(ThreadData *)pbi_00,in_EDX,in_ECX,in_R8,bVar2,BVar14);
      (*decode_partition::block_visit[(int)in_stack_00000008])
                (in_RDI,(ThreadData *)pbi_00,in_EDX + iVar4,in_ECX,in_R8,
                 (PARTITION_TYPE)((ushort)uVar10 >> 8),BVar14);
      (*decode_partition::block_visit[(int)in_stack_00000008])
                (in_RDI,(ThreadData *)pbi_00,in_EDX,in_ECX + iVar4,in_R8,
                 (PARTITION_TYPE)((ushort)uVar10 >> 8),(BLOCK_SIZE)uVar10);
      break;
    case 7:
      (*decode_partition::block_visit[(int)in_stack_00000008])
                (in_RDI,(ThreadData *)pbi_00,in_EDX,in_ECX,in_R8,bVar2,BVar1);
      PVar16 = (PARTITION_TYPE)((uint)iVar13 >> 0x18);
      (*decode_partition::block_visit[(int)in_stack_00000008])
                (in_RDI,(ThreadData *)pbi_00,in_EDX,in_ECX + iVar4,in_R8,PVar16,BVar14);
      (*decode_partition::block_visit[(int)in_stack_00000008])
                (in_RDI,(ThreadData *)pbi_00,in_EDX + iVar4,in_ECX + iVar4,in_R8,PVar16,BVar14);
      break;
    case 8:
      for (iVar4 = 0;
          (iVar4 < 4 &&
          ((iVar7 = in_EDX + iVar4 * mi_row_00, iVar4 < 1 || (iVar7 < (cm_00->mi_params).mi_rows))))
          ; iVar4 = iVar4 + 1) {
        (*decode_partition::block_visit[(int)in_stack_00000008])
                  (in_RDI,(ThreadData *)pbi_00,iVar7,in_ECX,in_R8,
                   (PARTITION_TYPE)((uint)iVar13 >> 0x18),(BLOCK_SIZE)((uint)iVar13 >> 0x10));
      }
      break;
    case 9:
      for (in_stack_ffffffffffffff64 = 0;
          (in_stack_ffffffffffffff64 < 4 &&
          ((in_stack_ffffffffffffff60 = in_ECX + in_stack_ffffffffffffff64 * mi_row_00,
           in_stack_ffffffffffffff64 < 1 || (in_stack_ffffffffffffff60 < (cm_00->mi_params).mi_cols)
           ))); in_stack_ffffffffffffff64 = in_stack_ffffffffffffff64 + 1) {
        (*decode_partition::block_visit[(int)in_stack_00000008])
                  (in_RDI,(ThreadData *)pbi_00,in_EDX,in_stack_ffffffffffffff60,in_R8,
                   (PARTITION_TYPE)((uint)iVar13 >> 0x18),(BLOCK_SIZE)((uint)iVar13 >> 0x10));
      }
    }
    if ((in_stack_00000008 & 1) != 0) {
      update_ext_partition_context
                ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,(BLOCK_SIZE)(uVar9 >> 0x38),
                 (BLOCK_SIZE)(uVar9 >> 0x30),(PARTITION_TYPE)(uVar9 >> 0x28));
    }
  }
  return;
}

Assistant:

static inline void decode_partition(AV1Decoder *const pbi, ThreadData *const td,
                                    int mi_row, int mi_col, aom_reader *reader,
                                    BLOCK_SIZE bsize, int parse_decode_flag) {
  assert(bsize < BLOCK_SIZES_ALL);
  AV1_COMMON *const cm = &pbi->common;
  DecoderCodingBlock *const dcb = &td->dcb;
  MACROBLOCKD *const xd = &dcb->xd;
  const int bw = mi_size_wide[bsize];
  const int hbs = bw >> 1;
  PARTITION_TYPE partition;
  BLOCK_SIZE subsize;
  const int quarter_step = bw / 4;
  BLOCK_SIZE bsize2 = get_partition_subsize(bsize, PARTITION_SPLIT);
  const int has_rows = (mi_row + hbs) < cm->mi_params.mi_rows;
  const int has_cols = (mi_col + hbs) < cm->mi_params.mi_cols;

  if (mi_row >= cm->mi_params.mi_rows || mi_col >= cm->mi_params.mi_cols)
    return;

  // parse_decode_flag takes the following values :
  // 01 - do parse only
  // 10 - do decode only
  // 11 - do parse and decode
  static const block_visitor_fn_t block_visit[4] = { NULL, parse_decode_block,
                                                     decode_block,
                                                     parse_decode_block };

  if (parse_decode_flag & 1) {
    const int num_planes = av1_num_planes(cm);
    for (int plane = 0; plane < num_planes; ++plane) {
      int rcol0, rcol1, rrow0, rrow1;

      // Skip some unnecessary work if loop restoration is disabled
      if (cm->rst_info[plane].frame_restoration_type == RESTORE_NONE) continue;

      if (av1_loop_restoration_corners_in_sb(cm, plane, mi_row, mi_col, bsize,
                                             &rcol0, &rcol1, &rrow0, &rrow1)) {
        const int rstride = cm->rst_info[plane].horz_units;
        for (int rrow = rrow0; rrow < rrow1; ++rrow) {
          for (int rcol = rcol0; rcol < rcol1; ++rcol) {
            const int runit_idx = rcol + rrow * rstride;
            loop_restoration_read_sb_coeffs(cm, xd, reader, plane, runit_idx);
          }
        }
      }
    }

    partition = (bsize < BLOCK_8X8) ? PARTITION_NONE
                                    : read_partition(xd, mi_row, mi_col, reader,
                                                     has_rows, has_cols, bsize);
  } else {
    partition = get_partition(cm, mi_row, mi_col, bsize);
  }
  subsize = get_partition_subsize(bsize, partition);
  if (subsize == BLOCK_INVALID) {
    // When an internal error occurs ensure that xd->mi_row is set appropriately
    // w.r.t. current tile, which is used to signal processing of current row is
    // done.
    xd->mi_row = mi_row;
    aom_internal_error(xd->error_info, AOM_CODEC_CORRUPT_FRAME,
                       "Partition is invalid for block size %dx%d",
                       block_size_wide[bsize], block_size_high[bsize]);
  }
  // Check the bitstream is conformant: if there is subsampling on the
  // chroma planes, subsize must subsample to a valid block size.
  const struct macroblockd_plane *const pd_u = &xd->plane[1];
  if (get_plane_block_size(subsize, pd_u->subsampling_x, pd_u->subsampling_y) ==
      BLOCK_INVALID) {
    // When an internal error occurs ensure that xd->mi_row is set appropriately
    // w.r.t. current tile, which is used to signal processing of current row is
    // done.
    xd->mi_row = mi_row;
    aom_internal_error(xd->error_info, AOM_CODEC_CORRUPT_FRAME,
                       "Block size %dx%d invalid with this subsampling mode",
                       block_size_wide[subsize], block_size_high[subsize]);
  }

#define DEC_BLOCK_STX_ARG
#define DEC_BLOCK_EPT_ARG partition,
#define DEC_BLOCK(db_r, db_c, db_subsize)                                  \
  block_visit[parse_decode_flag](pbi, td, DEC_BLOCK_STX_ARG(db_r), (db_c), \
                                 reader, DEC_BLOCK_EPT_ARG(db_subsize))
#define DEC_PARTITION(db_r, db_c, db_subsize)                        \
  decode_partition(pbi, td, DEC_BLOCK_STX_ARG(db_r), (db_c), reader, \
                   (db_subsize), parse_decode_flag)

  switch (partition) {
    case PARTITION_NONE: DEC_BLOCK(mi_row, mi_col, subsize); break;
    case PARTITION_HORZ:
      DEC_BLOCK(mi_row, mi_col, subsize);
      if (has_rows) DEC_BLOCK(mi_row + hbs, mi_col, subsize);
      break;
    case PARTITION_VERT:
      DEC_BLOCK(mi_row, mi_col, subsize);
      if (has_cols) DEC_BLOCK(mi_row, mi_col + hbs, subsize);
      break;
    case PARTITION_SPLIT:
      DEC_PARTITION(mi_row, mi_col, subsize);
      DEC_PARTITION(mi_row, mi_col + hbs, subsize);
      DEC_PARTITION(mi_row + hbs, mi_col, subsize);
      DEC_PARTITION(mi_row + hbs, mi_col + hbs, subsize);
      break;
    case PARTITION_HORZ_A:
      DEC_BLOCK(mi_row, mi_col, bsize2);
      DEC_BLOCK(mi_row, mi_col + hbs, bsize2);
      DEC_BLOCK(mi_row + hbs, mi_col, subsize);
      break;
    case PARTITION_HORZ_B:
      DEC_BLOCK(mi_row, mi_col, subsize);
      DEC_BLOCK(mi_row + hbs, mi_col, bsize2);
      DEC_BLOCK(mi_row + hbs, mi_col + hbs, bsize2);
      break;
    case PARTITION_VERT_A:
      DEC_BLOCK(mi_row, mi_col, bsize2);
      DEC_BLOCK(mi_row + hbs, mi_col, bsize2);
      DEC_BLOCK(mi_row, mi_col + hbs, subsize);
      break;
    case PARTITION_VERT_B:
      DEC_BLOCK(mi_row, mi_col, subsize);
      DEC_BLOCK(mi_row, mi_col + hbs, bsize2);
      DEC_BLOCK(mi_row + hbs, mi_col + hbs, bsize2);
      break;
    case PARTITION_HORZ_4:
      for (int i = 0; i < 4; ++i) {
        int this_mi_row = mi_row + i * quarter_step;
        if (i > 0 && this_mi_row >= cm->mi_params.mi_rows) break;
        DEC_BLOCK(this_mi_row, mi_col, subsize);
      }
      break;
    case PARTITION_VERT_4:
      for (int i = 0; i < 4; ++i) {
        int this_mi_col = mi_col + i * quarter_step;
        if (i > 0 && this_mi_col >= cm->mi_params.mi_cols) break;
        DEC_BLOCK(mi_row, this_mi_col, subsize);
      }
      break;
    default: assert(0 && "Invalid partition type");
  }

#undef DEC_PARTITION
#undef DEC_BLOCK
#undef DEC_BLOCK_EPT_ARG
#undef DEC_BLOCK_STX_ARG

  if (parse_decode_flag & 1)
    update_ext_partition_context(xd, mi_row, mi_col, subsize, bsize, partition);
}